

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

RTCBuffer rtcNewBufferHostDevice(RTCDevice hdevice,size_t byteSize)

{
  int iVar1;
  Buffer *this;
  char *pcVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  DeviceEnterLeave enterleave;
  DeviceEnterLeave local_50;
  long local_48;
  
  if (hdevice != (RTCDevice)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&local_50,hdevice);
    this = (Buffer *)operator_new(0x30);
    (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Buffer_02185000;
    this->device = (Device *)hdevice;
    this->numBytes = byteSize;
    (**(code **)(*(long *)hdevice + 0x10))(hdevice);
    pcVar2 = embree::Buffer::alloc(this,(void *)0x0,&this->shared,MALLOC);
    this->ptr = pcVar2;
    iVar1 = (*(this->super_RefCount)._vptr_RefCount[2])(this);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&local_50);
    return (RTCBuffer)CONCAT44(extraout_var,iVar1);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_50.device = (Device *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid argument","");
  *puVar3 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar3 + 1) = 2;
  puVar3[2] = puVar3 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 2),local_50.device,
             (undefined1 *)
             ((long)&((local_50.device)->super_State).super_RefCount._vptr_RefCount + local_48));
  __cxa_throw(puVar3,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API RTCBuffer rtcNewBufferHostDevice(RTCDevice hdevice, size_t byteSize)
  {
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcNewBufferHostDevice);
    RTC_VERIFY_HANDLE(hdevice);
    RTC_ENTER_DEVICE(hdevice);
    Buffer* buffer = new Buffer((Device*)hdevice, byteSize, nullptr, nullptr);
    return (RTCBuffer)buffer->refInc();
    RTC_CATCH_END((Device*)hdevice);
    return nullptr;
  }